

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  ostream *poVar1;
  Indent indent;
  string component_test;
  cmScriptGeneratorIndent local_40;
  int local_3c;
  string local_38;
  
  local_40.Level = 0;
  CreateComponentTest_abi_cxx11_
            (&local_38,(cmInstallGenerator *)os,(this->Component)._M_dataplus._M_p);
  cmScriptGeneratorIndent::Write(&local_40,os);
  poVar1 = std::operator<<(os,"if(");
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,")\n");
  local_3c = local_40.Level + 2;
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])(this,os);
  cmScriptGeneratorIndent::Write(&local_40,os);
  std::operator<<(os,"endif()\n\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str());
  os << indent << "if(" << component_test << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}